

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal_write_state.cpp
# Opt level: O1

void __thiscall
duckdb::WALWriteState::CommitEntry(WALWriteState *this,UndoFlags type,data_ptr_t data)

{
  bool bVar1;
  DataTableInfo *this_00;
  InternalException *this_01;
  SequenceValue *info;
  string local_40;
  
  switch(type) {
  case CATALOG_ENTRY:
    WriteCatalogEntry(this,*(CatalogEntry **)data,data + 8);
    return;
  case INSERT_TUPLE:
    bVar1 = DataTable::IsTemporary(*(DataTable **)data);
    if (!bVar1) {
      DataTable::WriteToLog
                (*(DataTable **)data,this->transaction,this->log,*(idx_t *)(data + 8),
                 *(idx_t *)(data + 0x10),(this->commit_state).ptr);
      return;
    }
    break;
  case DELETE_TUPLE:
    bVar1 = DataTable::IsTemporary(*(DataTable **)data);
    if (!bVar1) {
      WriteDelete(this,(DeleteInfo *)data);
      return;
    }
    break;
  case UPDATE_TUPLE:
    this_00 = ColumnData::GetTableInfo((ColumnData *)**(undefined8 **)data);
    bVar1 = DataTableInfo::IsTemporary(this_00);
    if (!bVar1) {
      WriteUpdate(this,(UpdateInfo *)data);
      return;
    }
    break;
  case SEQUENCE_VALUE:
    WriteAheadLog::WriteSequenceValue(this->log,*(SequenceValue *)data);
    break;
  default:
    this_01 = (InternalException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"UndoBuffer - don\'t know how to commit this type!","");
    InternalException::InternalException(this_01,&local_40);
    __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void WALWriteState::CommitEntry(UndoFlags type, data_ptr_t data) {
	switch (type) {
	case UndoFlags::CATALOG_ENTRY: {
		// set the commit timestamp of the catalog entry to the given id
		auto catalog_entry = Load<CatalogEntry *>(data);
		D_ASSERT(catalog_entry->HasParent());
		// push the catalog update to the WAL
		WriteCatalogEntry(*catalog_entry, data + sizeof(CatalogEntry *));
		break;
	}
	case UndoFlags::INSERT_TUPLE: {
		// append:
		auto info = reinterpret_cast<AppendInfo *>(data);
		if (!info->table->IsTemporary()) {
			info->table->WriteToLog(transaction, log, info->start_row, info->count, commit_state.get());
		}
		break;
	}
	case UndoFlags::DELETE_TUPLE: {
		// deletion:
		auto info = reinterpret_cast<DeleteInfo *>(data);
		if (!info->table->IsTemporary()) {
			WriteDelete(*info);
		}
		break;
	}
	case UndoFlags::UPDATE_TUPLE: {
		// update:
		auto info = reinterpret_cast<UpdateInfo *>(data);
		if (!info->segment->column_data.GetTableInfo().IsTemporary()) {
			WriteUpdate(*info);
		}
		break;
	}
	case UndoFlags::SEQUENCE_VALUE: {
		auto info = reinterpret_cast<SequenceValue *>(data);
		log.WriteSequenceValue(*info);
		break;
	}
	default:
		throw InternalException("UndoBuffer - don't know how to commit this type!");
	}
}